

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall
Js::TypedArrayBase::GetDiagTypeString
          (TypedArrayBase *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  undefined4 *puVar4;
  ScriptContext *requestContext_local;
  StringBuilder<Memory::ArenaAllocator> *stringBuilder_local;
  TypedArrayBase *this_local;
  
  TVar3 = RecyclableObject::GetTypeId((RecyclableObject *)this);
  switch(TVar3) {
  case TypeIds_Int8Array:
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<20ul>
              (stringBuilder,(char16 (*) [20])L"Object, (Int8Array)");
    break;
  case TypeIds_Uint8Array:
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<21ul>
              (stringBuilder,(char16 (*) [21])L"Object, (Uint8Array)");
    break;
  case TypeIds_Uint8ClampedArray:
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<28ul>
              (stringBuilder,(char16 (*) [28])L"Object, (Uint8ClampedArray)");
    break;
  case TypeIds_Int16Array:
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<21ul>
              (stringBuilder,(char16 (*) [21])L"Object, (Int16Array)");
    break;
  case TypeIds_Uint16Array:
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<22ul>
              (stringBuilder,(char16 (*) [22])L"Object, (Uint16Array)");
    break;
  case TypeIds_Int32Array:
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<21ul>
              (stringBuilder,(char16 (*) [21])L"Object, (Int32Array)");
    break;
  case TypeIds_Uint32Array:
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<22ul>
              (stringBuilder,(char16 (*) [22])L"Object, (Uint32Array)");
    break;
  case TypeIds_Float32Array:
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<23ul>
              (stringBuilder,(char16 (*) [23])L"Object, (Float32Array)");
    break;
  case TypeIds_Float64Array:
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<23ul>
              (stringBuilder,(char16 (*) [23])L"Object, (Float64Array)");
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x91d,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<7ul>
              (stringBuilder,(char16 (*) [7])0x198fee2);
  }
  return 1;
}

Assistant:

BOOL TypedArrayBase::GetDiagTypeString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        switch(GetTypeId())
        {
        case TypeIds_Int8Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Int8Array)"));
            break;

        case TypeIds_Uint8Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Uint8Array)"));
            break;

        case TypeIds_Uint8ClampedArray:
            stringBuilder->AppendCppLiteral(_u("Object, (Uint8ClampedArray)"));
            break;

        case TypeIds_Int16Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Int16Array)"));
            break;

        case TypeIds_Uint16Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Uint16Array)"));
            break;

        case TypeIds_Int32Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Int32Array)"));
            break;

        case TypeIds_Uint32Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Uint32Array)"));
            break;

        case TypeIds_Float32Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Float32Array)"));
            break;

        case TypeIds_Float64Array:
            stringBuilder->AppendCppLiteral(_u("Object, (Float64Array)"));
            break;

        default:
            Assert(false);
            stringBuilder->AppendCppLiteral(_u("Object"));
            break;
        }

        return TRUE;
    }